

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

curl_socket_t Curl_getconnectinfo(SessionHandle *data,connectdata **connp)

{
  ssize_t sVar1;
  undefined1 local_41;
  connectdata *pcStack_40;
  char buf;
  connfind find;
  connectdata *c;
  curl_socket_t sockfd;
  connectdata **connp_local;
  SessionHandle *data_local;
  
  if (((data->state).lastconnect == (connectdata *)0x0) || (data->multi_easy == (Curl_multi *)0x0))
  {
    data_local._4_4_ = -1;
  }
  else {
    find._8_8_ = (data->state).lastconnect;
    pcStack_40 = (data->state).lastconnect;
    find.tofind._0_1_ = 0;
    Curl_conncache_foreach(data->multi_easy->conn_cache,&stack0xffffffffffffffc0,conn_is_conn);
    if (((byte)find.tofind & 1) == 0) {
      (data->state).lastconnect = (connectdata *)0x0;
      data_local._4_4_ = -1;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = (connectdata *)find._8_8_;
      }
      data_local._4_4_ = *(curl_socket_t *)(find._8_8_ + 0x1d0);
      if ((*(byte *)(find._8_8_ + 0x208) & 1) == 0) {
        sVar1 = recv(*(int *)(find._8_8_ + 0x1d0),&local_41,1,2);
        if (sVar1 == 0) {
          data_local._4_4_ = -1;
        }
      }
      else {
        data_local._4_4_ = -1;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct SessionHandle *data,
                                  struct connectdata **connp)
{
  curl_socket_t sockfd;

  DEBUGASSERT(data);

  /* this only works for an easy handle that has been used for
     curl_easy_perform()! */
  if(data->state.lastconnect && data->multi_easy) {
    struct connectdata *c = data->state.lastconnect;
    struct connfind find;
    find.tofind = data->state.lastconnect;
    find.found = FALSE;

    Curl_conncache_foreach(data->multi_easy->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect = NULL;
      return CURL_SOCKET_BAD;
    }

    if(connp)
      /* only store this if the caller cares for it */
      *connp = c;
    sockfd = c->sock[FIRSTSOCKET];
    /* we have a socket connected, let's determine if the server shut down */
    /* determine if ssl */
    if(c->ssl[FIRSTSOCKET].use) {
      /* use the SSL context */
      if(!Curl_ssl_check_cxn(c))
        return CURL_SOCKET_BAD;   /* FIN received */
    }
/* Minix 3.1 doesn't support any flags on recv; just assume socket is OK */
#ifdef MSG_PEEK
    else {
      /* use the socket */
      char buf;
      if(recv((RECV_TYPE_ARG1)c->sock[FIRSTSOCKET], (RECV_TYPE_ARG2)&buf,
              (RECV_TYPE_ARG3)1, (RECV_TYPE_ARG4)MSG_PEEK) == 0) {
        return CURL_SOCKET_BAD;   /* FIN received */
      }
    }
#endif
  }
  else
    return CURL_SOCKET_BAD;

  return sockfd;
}